

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10310e3::BlendA64Mask1DTest8B_ExtremeValues_Test::TestBody
          (BlendA64Mask1DTest8B_ExtremeValues_Test *this)

{
  int iVar1;
  ACMRandom *in_RDI;
  int bsize;
  int i_1;
  int i;
  int in_stack_0000006c;
  BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
  *in_stack_00000070;
  int in_stack_ffffffffffffffdc;
  int local_14;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 0x14000; local_c = local_c + 1) {
    iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
    *(char *)((long)&in_RDI[0xe].random_.state_ + (long)local_c) = (char)iVar1 + -2;
    iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
    *(char *)((long)&in_RDI[0x500e].random_.state_ + (long)local_c) = (char)iVar1 + -2;
    iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
    *(char *)((long)&in_RDI[0xa010].random_.state_ + (long)local_c) = (char)iVar1 + -2;
    iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
    *(char *)((long)&in_RDI[0xf012].random_.state_ + (long)local_c) = (char)iVar1 + -2;
  }
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
    *(char *)((long)&in_RDI[0x14014].random_.state_ + (long)local_10) = (char)iVar1 + '?';
  }
  for (local_14 = 0; local_14 < 0x16; local_14 = local_14 + 1) {
    BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
    ::Common(in_stack_00000070,in_stack_0000006c);
  }
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTest8B, ExtremeValues) {
  for (int i = 0; i < kBufSize; ++i) {
    dst_ref_[i] = rng_(2) + 254;
    dst_tst_[i] = rng_(2) + 254;
    src0_[i] = rng_(2) + 254;
    src1_[i] = rng_(2) + 254;
  }

  for (int i = 0; i < kMaxMaskSize; ++i)
    mask_[i] = rng_(2) + AOM_BLEND_A64_MAX_ALPHA - 1;

  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    Common(bsize);
  }
}